

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  socket_t sVar4;
  const_iterator cVar5;
  string ip;
  string local_90;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  if (((this->proxy_host_)._M_string_length == 0) || (iVar2 = this->proxy_port_, iVar2 == -1)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->addr_map_)._M_t,&this->host_);
    if ((_Rb_tree_header *)cVar5._M_node != &(this->addr_map_)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (cVar5._M_node + 2));
    }
    iVar2 = this->port_;
    iVar3 = this->address_family_;
    bVar1 = this->tcp_nodelay_;
    std::function<void_(int)>::function((function<void_(int)> *)&local_70,&this->socket_options_);
    sVar4 = detail::create_client_socket
                      (&this->host_,&local_90,iVar2,iVar3,bVar1,(SocketOptions *)&local_70,
                       this->connection_timeout_sec_,this->connection_timeout_usec_,
                       this->read_timeout_sec_,this->read_timeout_usec_,this->write_timeout_sec_,
                       this->write_timeout_usec_,&this->interface_,error);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return sVar4;
    }
  }
  else {
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    iVar3 = this->address_family_;
    bVar1 = this->tcp_nodelay_;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::function<void_(int)>::function((function<void_(int)> *)&local_50,&this->socket_options_);
    sVar4 = detail::create_client_socket
                      (&this->proxy_host_,&local_90,iVar2,iVar3,bVar1,(SocketOptions *)&local_50,
                       this->connection_timeout_sec_,this->connection_timeout_usec_,
                       this->read_timeout_sec_,this->read_timeout_usec_,this->write_timeout_sec_,
                       this->write_timeout_usec_,&this->interface_,error);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return sVar4;
    }
  }
  operator_delete(local_90._M_dataplus._M_p,
                  CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                           local_90.field_2._M_local_buf[0]) + 1);
  return sVar4;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error &error) const {
  if (!proxy_host_.empty() && proxy_port_ != -1) {
    return detail::create_client_socket(
        proxy_host_, std::string(), proxy_port_, address_family_, tcp_nodelay_,
        socket_options_, connection_timeout_sec_, connection_timeout_usec_,
        read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
        write_timeout_usec_, interface_, error);
  }

  // Check is custom IP specified for host_
  std::string ip;
  auto it = addr_map_.find(host_);
  if (it != addr_map_.end()) ip = it->second;

  return detail::create_client_socket(
      host_, ip, port_, address_family_, tcp_nodelay_, socket_options_,
      connection_timeout_sec_, connection_timeout_usec_, read_timeout_sec_,
      read_timeout_usec_, write_timeout_sec_, write_timeout_usec_, interface_,
      error);
}